

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O0

spvc_bool spvc_compiler_hlsl_is_resource_used
                    (spvc_compiler compiler,SpvExecutionModel model,uint set,uint binding)

{
  spvc_context_s *this;
  CompilerHLSL *this_00;
  CompilerHLSL *hlsl;
  allocator local_49;
  string local_48;
  uint local_24;
  uint local_20;
  uint binding_local;
  uint set_local;
  SpvExecutionModel model_local;
  spvc_compiler compiler_local;
  
  local_24 = binding;
  local_20 = set;
  binding_local = model;
  _set_local = compiler;
  if (compiler->backend == SPVC_BACKEND_HLSL) {
    this_00 = (CompilerHLSL *)
              std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::
              get(&compiler->compiler);
    compiler_local._7_1_ =
         spirv_cross::CompilerHLSL::is_hlsl_resource_binding_used
                   (this_00,binding_local,local_20,local_24);
  }
  else {
    this = compiler->context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"HLSL function used on a non-HLSL backend.",&local_49);
    spvc_context_s::report_error(this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    compiler_local._7_1_ = false;
  }
  return compiler_local._7_1_;
}

Assistant:

spvc_bool spvc_compiler_hlsl_is_resource_used(spvc_compiler compiler, SpvExecutionModel model, unsigned set,
                                              unsigned binding)
{
#if SPIRV_CROSS_C_API_HLSL
	if (compiler->backend != SPVC_BACKEND_HLSL)
	{
		compiler->context->report_error("HLSL function used on a non-HLSL backend.");
		return SPVC_FALSE;
	}

	auto &hlsl = *static_cast<CompilerHLSL *>(compiler->compiler.get());
	return hlsl.is_hlsl_resource_binding_used(static_cast<spv::ExecutionModel>(model), set, binding) ? SPVC_TRUE :
	       SPVC_FALSE;
#else
	(void)model;
	(void)set;
	(void)binding;
	compiler->context->report_error("HLSL function used on a non-HLSL backend.");
	return SPVC_FALSE;
#endif
}